

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int xmlEncInputChunk(xmlCharEncodingHandler *handler,uchar *out,int *outlen,uchar *in,int *inlen,
                    int flush)

{
  int local_38;
  int ret;
  int flush_local;
  int *inlen_local;
  uchar *in_local;
  int *outlen_local;
  uchar *out_local;
  xmlCharEncodingHandler *handler_local;
  
  if (handler->input == (xmlCharEncodingInputFunc)0x0) {
    if (handler->iconv_in == (iconv_t)0x0) {
      *outlen = 0;
      *inlen = 0;
      local_38 = -2;
    }
    else {
      local_38 = xmlIconvWrapper(handler->iconv_in,out,outlen,in,inlen);
    }
  }
  else {
    local_38 = (*handler->input)(out,outlen,in,inlen);
    if (0 < local_38) {
      local_38 = 0;
    }
  }
  return local_38;
}

Assistant:

static int
xmlEncInputChunk(xmlCharEncodingHandler *handler, unsigned char *out,
                 int *outlen, const unsigned char *in, int *inlen, int flush) {
    int ret;
    (void)flush;

    if (handler->input != NULL) {
        ret = handler->input(out, outlen, in, inlen);
        if (ret > 0)
           ret = 0;
    }
#ifdef LIBXML_ICONV_ENABLED
    else if (handler->iconv_in != NULL) {
        ret = xmlIconvWrapper(handler->iconv_in, out, outlen, in, inlen);
    }
#endif /* LIBXML_ICONV_ENABLED */
#ifdef LIBXML_ICU_ENABLED
    else if (handler->uconv_in != NULL) {
        ret = xmlUconvWrapper(handler->uconv_in, 1, out, outlen, in, inlen,
                              flush);
    }
#endif /* LIBXML_ICU_ENABLED */
    else {
        *outlen = 0;
        *inlen = 0;
        ret = -2;
    }

    return(ret);
}